

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O2

void __thiscall
Rml::ElementFormControlTextArea::OnPropertyChange
          (ElementFormControlTextArea *this,PropertyIdSet *changed_properties)

{
  bool bVar1;
  PropertyIdSet *__x;
  PropertyIdSet *__y;
  bitset<128UL> bVar2;
  _Base_bitset<2UL> local_28;
  
  Element::OnPropertyChange((Element *)this,changed_properties);
  __x = StyleSheetSpecification::GetRegisteredInheritedProperties();
  __y = StyleSheetSpecification::GetRegisteredPropertiesForcingLayout();
  local_28._M_w = (_WordT  [2])::std::operator&(&__x->defined_ids,&__y->defined_ids);
  bVar2 = ::std::operator&(&changed_properties->defined_ids,(bitset<128UL> *)&local_28);
  if (bVar2.super__Base_bitset<2UL>._M_w[1] != 0 || bVar2.super__Base_bitset<2UL>._M_w[0] != 0) {
    WidgetTextInput::ForceFormattingOnNextLayout
              (&((this->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
                 .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
                super_WidgetTextInput);
  }
  bVar1 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x2c);
  if (!bVar1) {
    bVar1 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x2b);
    if (!bVar1) goto LAB_002f3295;
  }
  WidgetTextInput::UpdateSelectionColours
            (&((this->widget)._M_t.
               super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
              super_WidgetTextInput);
LAB_002f3295:
  bVar1 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x2d);
  if (bVar1) {
    WidgetTextInput::GenerateCursor
              (&((this->widget)._M_t.
                 super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
                 .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
                super_WidgetTextInput);
  }
  return;
}

Assistant:

void ElementFormControlTextArea::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	ElementFormControl::OnPropertyChange(changed_properties);

	// Some inherited properties require text formatting update, mainly font and line-height properties.
	const PropertyIdSet changed_inherited_layout_properties = changed_properties &
		(StyleSheetSpecification::GetRegisteredInheritedProperties() & StyleSheetSpecification::GetRegisteredPropertiesForcingLayout());

	if (!changed_inherited_layout_properties.Empty())
		widget->ForceFormattingOnNextLayout();

	if (changed_properties.Contains(PropertyId::Color) || changed_properties.Contains(PropertyId::BackgroundColor))
		widget->UpdateSelectionColours();

	if (changed_properties.Contains(PropertyId::CaretColor))
		widget->GenerateCursor();
}